

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTiming.c
# Opt level: O2

void Abc_NtkTimeSetArrival(Abc_Ntk_t *pNtk,int ObjId,float Rise,float Fall)

{
  float *pfVar1;
  Abc_ManTime_t *p;
  
  p = pNtk->pManTime;
  if (p == (Abc_ManTime_t *)0x0) {
    p = Abc_ManTimeStart(pNtk);
    pNtk->pManTime = p;
  }
  Abc_ManTimeExpand(p,ObjId + 1,1);
  pfVar1 = (float *)pNtk->pManTime->vArrs->pArray[ObjId];
  *pfVar1 = Rise;
  pfVar1[1] = Fall;
  return;
}

Assistant:

void Abc_NtkTimeSetArrival( Abc_Ntk_t * pNtk, int ObjId, float Rise, float Fall )
{
    Vec_Ptr_t * vTimes;
    Abc_Time_t * pTime;
    if ( pNtk->pManTime == NULL )
        pNtk->pManTime = Abc_ManTimeStart(pNtk);
    Abc_ManTimeExpand( pNtk->pManTime, ObjId + 1, 1 );
    // set the arrival time
    vTimes = pNtk->pManTime->vArrs;
    pTime = (Abc_Time_t *)vTimes->pArray[ObjId];
    pTime->Rise  = Rise;
    pTime->Fall  = Fall;
}